

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

string * __thiscall
pbrt::FloatPtexTexture::ToString_abi_cxx11_(string *__return_storage_ptr__,FloatPtexTexture *this)

{
  string local_38;
  
  PtexTextureBase::BaseToString_abi_cxx11_(&local_38,&this->super_PtexTextureBase);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<std::__cxx11::string>
            (__return_storage_ptr__,"[ FloatPtexTexture %s ]",&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FloatPtexTexture::ToString() const {
    return StringPrintf("[ FloatPtexTexture %s ]", BaseToString());
}